

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_28bf56::PulseCapture::stop(PulseCapture *this)

{
  pa_operation *op;
  unique_lock<std::mutex> plock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &(this->mMainloop).mMutex;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  op = (pa_operation *)
       (*(anonymous_namespace)::ppa_stream_cork)
                 (this->mStream,1,PulseMainloop::streamSuccessCallbackC,&this->mMainloop);
  PulseMainloop::waitForOperation(&this->mMainloop,op,&local_28);
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void PulseCapture::stop()
{
    auto plock = mMainloop.getUniqueLock();
    pa_operation *op{pa_stream_cork(mStream, 1, &PulseMainloop::streamSuccessCallbackC,
        &mMainloop)};
    mMainloop.waitForOperation(op, plock);
}